

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O3

void ParseGetInfoResult(UniValue *result)

{
  char *pcVar1;
  VType VVar2;
  pointer pUVar3;
  pointer pcVar4;
  pointer pbVar5;
  double dVar6;
  string str;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  UniValue *pUVar10;
  runtime_error *this;
  UniValue *pUVar11;
  UniValue *pUVar12;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar13;
  iterator iVar14;
  mapped_type *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  _Alloc_hider _Var16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  _Base_ptr args;
  string *proxy_1;
  pointer pbVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer this_01;
  char *__end;
  long in_FS_OFFSET;
  bool bVar21;
  double dVar22;
  string_view key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  proxy_networks;
  size_t max_balance_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  formatted_proxies;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ordered_proxies;
  string warnings;
  string ibd_progress_bar;
  string result_string;
  string CYAN;
  string MAGENTA;
  string YELLOW;
  string BLUE;
  string GREEN;
  string RESET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  double dVar23;
  double in_stack_fffffffffffffdb0;
  long *local_248 [2];
  long local_238 [2];
  undefined1 local_228 [32];
  _Base_ptr local_208;
  size_t local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  key._M_str = "error";
  key._M_len = 5;
  pUVar10 = UniValue::find_value(result,key);
  if (pUVar10->typ == VNULL) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    iVar9 = fileno(_stdout);
    iVar9 = isatty(iVar9);
    bVar21 = iVar9 != 0;
    pcVar1 = local_228 + 0x10;
    local_228._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"-color","");
    bVar8 = ArgsManager::IsArgSet(&gArgs,(string *)local_228);
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (bVar8) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"-color","");
      ArgsManager::GetArg((string *)local_228,&gArgs,&local_118,&DEFAULT_COLOR_SETTING_abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228
                      ,"always");
      if (iVar9 == 0) {
        bVar21 = true;
      }
      else {
        iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_228,"never");
        if (iVar9 == 0) {
          bVar21 = false;
        }
        else {
          iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_228,"auto");
          if (iVar9 != 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this,"Invalid value for -color option. Valid values: always, auto, never.");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00125858;
          }
        }
      }
      if ((char *)local_228._0_8_ != pcVar1) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      if (bVar21) {
LAB_00123595:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_58,0,local_58._M_string_length,"\x1b[0m",4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_78,0,local_78._M_string_length,"\x1b[32m",5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_98,0,local_98._M_string_length,"\x1b[34m",5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_b8,0,local_b8._M_string_length,"\x1b[33m",5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_d8,0,local_d8._M_string_length,"\x1b[35m",5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_f8,0,local_f8._M_string_length,"\x1b[36m",5);
      }
    }
    else if (iVar9 != 0) goto LAB_00123595;
    local_228._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"chain","");
    pUVar10 = UniValue::operator[](result,(string *)local_228);
    pbVar17 = &pUVar10->val;
    args_1 = &local_58;
    pbVar20 = args_1;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_118,(tinyformat *)"%sChain: %s%s\n",(char *)&local_98,pbVar17,args_1,in_R9);
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"blocks","");
    pUVar10 = UniValue::operator[](result,&local_138);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"Blocks: %s\n",(char *)&pUVar10->val,pbVar17);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"headers","");
    pUVar10 = UniValue::operator[](result,&local_138);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"Headers: %s\n",(char *)&pUVar10->val,pbVar17);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    local_228._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"verificationprogress","");
    pUVar10 = UniValue::operator[](result,(string *)local_228);
    dVar23 = UniValue::get_real(pUVar10);
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    if (dVar23 < 0.99) {
      if ((0.0 <= dVar23) && (dVar23 <= 1.0)) {
        if (GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_ == '\0') {
          ParseGetInfoResult();
        }
        if (GetProgressBar(double,std::__cxx11::string&)::INCOMPLETE_BAR_abi_cxx11_ == '\0') {
          ParseGetInfoResult();
        }
        dVar22 = dVar23 / 0.05;
        if (0.0 < dVar22) {
          iVar9 = 1;
          do {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_138,
                      GetProgressBar(double,std::__cxx11::string&)::COMPLETE_BAR_abi_cxx11_,
                      DAT_001e4558);
            dVar6 = (double)iVar9;
            iVar9 = iVar9 + 1;
          } while (dVar6 < dVar22);
        }
        in_stack_fffffffffffffdb0 = (1.0 - dVar23) / 0.05;
        if (0.0 < in_stack_fffffffffffffdb0) {
          iVar9 = 1;
          do {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_138,
                      GetProgressBar(double,std::__cxx11::string&)::INCOMPLETE_BAR_abi_cxx11_,
                      DAT_001e4580);
            dVar22 = (double)iVar9;
            iVar9 = iVar9 + 1;
          } while (dVar22 < in_stack_fffffffffffffdb0);
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_138," ");
    }
    local_158._0_8_ = dVar23 * 100.0;
    pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
    tinyformat::format<std::__cxx11::string,double>
              ((string *)local_228,(tinyformat *)"Verification progress: %s%.4f%%\n",
               (char *)&local_138,pbVar17,(double *)pbVar20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"difficulty","");
    pUVar10 = UniValue::operator[](result,(string *)local_158);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"Difficulty: %s\n\n",(char *)&pUVar10->val,pbVar17)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((char *)local_228._0_8_ != pcVar1) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"connections","");
    pUVar10 = UniValue::operator[](result,(string *)local_158);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"in","");
    pUVar10 = UniValue::operator[](pUVar10,(string *)local_178);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"connections","");
    pUVar11 = UniValue::operator[](result,&local_198);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"out","");
    pUVar11 = UniValue::operator[](pUVar11,&local_1b8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"connections","");
    pUVar12 = UniValue::operator[](result,&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"total","");
    pUVar12 = UniValue::operator[](pUVar12,&local_1f8);
    pbVar18 = &pUVar10->val;
    pbVar20 = &pUVar11->val;
    pbVar17 = &pUVar12->val;
    tinyformat::
    format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"%sNetwork: in %s, out %s, total %s%s\n",
               (char *)&local_78,pbVar18,pbVar20,pbVar17,args_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"version","");
    pUVar10 = UniValue::operator[](result,(string *)local_158);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"Version: %s\n",(char *)&pUVar10->val,pbVar18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"timeoffset","");
    pUVar10 = UniValue::operator[](result,(string *)local_158);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_228,(tinyformat *)"Time offset (s): %s\n",(char *)&pUVar10->val,
               pbVar18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_228._0_8_,CONCAT44(local_228._12_4_,local_228._8_4_));
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    pUVar10 = result;
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    args = (_Base_ptr)(local_228 + 8);
    local_228._8_4_ = _S_red;
    local_228._16_8_ = 0;
    local_200 = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_158._0_8_ = local_158 + 0x10;
    local_228._24_8_ = args;
    local_208 = args;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"networks","");
    pUVar11 = UniValue::operator[](result,(string *)local_158);
    pvVar13 = UniValue::getValues(pUVar11);
    if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    this_01 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar3 = (pvVar13->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pUVar3) {
      do {
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"proxy","");
        pUVar11 = UniValue::operator[](this_01,(string *)local_178);
        args = (_Base_ptr)(local_158 + 0x10);
        pcVar4 = (pUVar11->val)._M_dataplus._M_p;
        local_158._0_8_ = args;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_158,pcVar4,pcVar4 + (pUVar11->val)._M_string_length);
        if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        if (local_158._8_8_ != 0) {
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)local_228,(key_type *)local_158);
          args = (_Base_ptr)(local_228 + 8);
          if (iVar14._M_node == args) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_1b8,(key_type *)local_158);
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)local_228,(key_type *)local_158);
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"name","");
          pUVar11 = UniValue::operator[](this_01,(string *)local_178);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,&pUVar11->val);
          if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
        }
        if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        this_01 = this_01 + 1;
      } while (this_01 != pUVar3);
    }
    local_1d8._M_dataplus._M_p = (pointer)0x0;
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d8,
              (long)(local_1b8._M_string_length - (long)local_1b8._M_dataplus._M_p) >> 5);
    sVar7 = local_1b8._M_string_length;
    if (local_1b8._M_dataplus._M_p != (pointer)local_1b8._M_string_length) {
      _Var16._M_p = local_1b8._M_dataplus._M_p;
      do {
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)local_228,(key_type *)_Var16._M_p);
        util::
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
                  ((_Base_ptr)local_178,(util *)(iVar14._M_node + 2),", ");
        args = (_Base_ptr)local_178;
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_158,(tinyformat *)"%s (%s)",_Var16._M_p,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   pbVar20);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                   (string *)local_158);
        if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        _Var16._M_p = _Var16._M_p + 0x20;
      } while (_Var16._M_p != (pointer)sVar7);
    }
    if (local_1d8._M_dataplus._M_p == (pointer)local_1d8._M_string_length) {
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"n/a","");
    }
    else {
      util::
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
                ((_Alloc_hider *)local_178,(util *)&local_1d8,", ");
    }
    pUVar11 = pUVar10;
    tinyformat::format<std::__cxx11::string>
              ((string *)local_158,(tinyformat *)"Proxies: %s\n",(char *)local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_158._0_8_,local_158._8_8_);
    if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"relayfee","");
    pUVar12 = UniValue::operator[](pUVar10,(string *)local_178);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)local_158,(tinyformat *)"Min tx relay fee rate (%s/kvB): %s\n\n",
               (char *)&CURRENCY_UNIT_abi_cxx11_,&pUVar12->val,pbVar20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_158._0_8_,local_158._8_8_);
    if ((_Base_ptr)local_158._0_8_ != (_Base_ptr)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"has_wallet","");
    pUVar12 = UniValue::operator[](pUVar10,(string *)local_158);
    VVar2 = pUVar12->typ;
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if (VVar2 != VNULL) {
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"walletname","");
      pUVar12 = UniValue::operator[](pUVar10,(string *)local_178);
      local_158._0_8_ = local_158 + 0x10;
      pcVar4 = (pUVar12->val)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,pcVar4,pcVar4 + (pUVar12->val)._M_string_length);
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      if (local_158._8_8_ == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\"\"","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_158._0_8_,(pointer)(local_158._0_8_ + local_158._8_8_)
                  );
      }
      pbVar18 = &local_198;
      pbVar20 = &local_58;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_178,(tinyformat *)"%sWallet: %s%s\n",(char *)&local_d8,pbVar18,
                 pbVar20,pbVar17);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_118,(char *)local_178._0_8_,local_178._8_8_);
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"keypoolsize","");
      pUVar12 = UniValue::operator[](pUVar10,&local_198);
      tinyformat::format<std::__cxx11::string>
                ((string *)local_178,(tinyformat *)"Keypool size: %s\n",(char *)&pUVar12->val,
                 pbVar18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_118,(char *)local_178._0_8_,local_178._8_8_);
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"unlocked_until","");
      pUVar12 = UniValue::operator[](pUVar10,(string *)local_178);
      VVar2 = pUVar12->typ;
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if (VVar2 != VNULL) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"unlocked_until","");
        pUVar12 = UniValue::operator[](pUVar10,&local_198);
        tinyformat::format<std::__cxx11::string>
                  ((string *)local_178,(tinyformat *)"Unlocked until: %s\n",(char *)&pUVar12->val,
                   pbVar18);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_118,(char *)local_178._0_8_,local_178._8_8_);
        if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"paytxfee","");
      pUVar12 = UniValue::operator[](pUVar10,&local_198);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_178,
                 (tinyformat *)"Transaction fee rate (-paytxfee) (%s/kvB): %s\n\n",
                 (char *)&CURRENCY_UNIT_abi_cxx11_,&pUVar12->val,pbVar20);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_118,(char *)local_178._0_8_,local_178._8_8_);
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"balance","");
    pUVar12 = UniValue::operator[](pUVar10,(string *)local_158);
    VVar2 = pUVar12->typ;
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if (VVar2 != VNULL) {
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"balance","");
      pUVar12 = UniValue::operator[](pUVar10,(string *)local_178);
      pbVar20 = &pUVar12->val;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_158,(tinyformat *)"%sBalance:%s %s\n\n",(char *)&local_f8,&local_58
                 ,pbVar20,pbVar17);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_118,(char *)local_158._0_8_,local_158._8_8_);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
      }
    }
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"balances","");
    pUVar12 = UniValue::operator[](pUVar10,(string *)local_158);
    VVar2 = pUVar12->typ;
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    if (VVar2 != VNULL) {
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_158,(tinyformat *)"%sBalances%s\n",(char *)&local_f8,&local_58,
                 pbVar20);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_118,(char *)local_158._0_8_,local_158._8_8_);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      local_1f8._M_dataplus._M_p = (pointer)0xa;
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"balances","");
      pUVar10 = UniValue::operator[](pUVar10,(string *)local_158);
      pvVar15 = UniValue::getKeys_abi_cxx11_(pUVar10);
      pUVar10 = pUVar11;
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        pUVar10 = pUVar11;
      }
      pbVar19 = (pvVar15->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (pvVar15->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar19 != pbVar5) {
        do {
          local_158._0_8_ = local_158 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"balances","");
          pUVar11 = UniValue::operator[](pUVar10,(string *)local_158);
          pUVar11 = UniValue::operator[](pUVar11,pbVar19);
          _Var16._M_p = (pointer)(pUVar11->val)._M_string_length;
          if (_Var16._M_p <= local_1f8._M_dataplus._M_p) {
            _Var16._M_p = local_1f8._M_dataplus._M_p;
          }
          local_1f8._M_dataplus._M_p = _Var16._M_p;
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar5);
      }
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"balances","");
      pUVar11 = UniValue::operator[](pUVar10,(string *)local_158);
      pvVar15 = UniValue::getKeys_abi_cxx11_(pUVar11);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      pbVar19 = (pvVar15->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (pvVar15->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar19 != pbVar5) {
        do {
          local_178._0_8_ = local_178 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"balances","");
          pUVar11 = UniValue::operator[](pUVar10,(string *)local_178);
          pUVar11 = UniValue::operator[](pUVar11,pbVar19);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          if (pbVar19->_M_string_length == 0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\"\"","");
          }
          else {
            pcVar4 = (pbVar19->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,pcVar4,pcVar4 + pbVar19->_M_string_length);
          }
          tinyformat::format<unsigned_long,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_158,(tinyformat *)"%*s %s\n",(char *)&local_1f8,
                     (unsigned_long *)&pUVar11->val,&local_198,pbVar17);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_118,(char *)local_158._0_8_,local_158._8_8_);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar5);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_118,"\n");
      pUVar11 = pUVar10;
    }
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"warnings","");
    pUVar12 = UniValue::operator[](pUVar10,(string *)local_178);
    local_158._0_8_ = local_158 + 0x10;
    pcVar4 = (pUVar12->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,pcVar4,pcVar4 + (pUVar12->val)._M_string_length);
    if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    if (local_158._8_8_ == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"(none)","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,local_158._0_8_,(pointer)(local_158._0_8_ + local_158._8_8_));
    }
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((string *)local_178,(tinyformat *)"%sWarnings:%s %s",(char *)&local_b8,&local_58,
               &local_198,pbVar17);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_118,(char *)local_178._0_8_,local_178._8_8_);
    if ((_Alloc_hider *)local_178._0_8_ != (_Alloc_hider *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    local_248[0] = local_238;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    str._M_string_length = (size_type)pUVar11;
    str._M_dataplus._M_p = (pointer)args_1;
    str.field_2._M_allocated_capacity = (size_type)dVar23;
    str.field_2._8_8_ = in_stack_fffffffffffffdb0;
    UniValue::setStr(pUVar10,str);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00125858:
  __stack_chk_fail();
}

Assistant:

static void ParseGetInfoResult(UniValue& result)
{
    if (!result.find_value("error").isNull()) return;

    std::string RESET, GREEN, BLUE, YELLOW, MAGENTA, CYAN;
    bool should_colorize = false;

#ifndef WIN32
    if (isatty(fileno(stdout))) {
        // By default, only print colored text if OS is not WIN32 and stdout is connected to a terminal.
        should_colorize = true;
    }
#endif

    if (gArgs.IsArgSet("-color")) {
        const std::string color{gArgs.GetArg("-color", DEFAULT_COLOR_SETTING)};
        if (color == "always") {
            should_colorize = true;
        } else if (color == "never") {
            should_colorize = false;
        } else if (color != "auto") {
            throw std::runtime_error("Invalid value for -color option. Valid values: always, auto, never.");
        }
    }

    if (should_colorize) {
        RESET = "\x1B[0m";
        GREEN = "\x1B[32m";
        BLUE = "\x1B[34m";
        YELLOW = "\x1B[33m";
        MAGENTA = "\x1B[35m";
        CYAN = "\x1B[36m";
    }

    std::string result_string = strprintf("%sChain: %s%s\n", BLUE, result["chain"].getValStr(), RESET);
    result_string += strprintf("Blocks: %s\n", result["blocks"].getValStr());
    result_string += strprintf("Headers: %s\n", result["headers"].getValStr());

    const double ibd_progress{result["verificationprogress"].get_real()};
    std::string ibd_progress_bar;
    // Display the progress bar only if IBD progress is less than 99%
    if (ibd_progress < 0.99) {
      GetProgressBar(ibd_progress, ibd_progress_bar);
      // Add padding between progress bar and IBD progress
      ibd_progress_bar += " ";
    }

    result_string += strprintf("Verification progress: %s%.4f%%\n", ibd_progress_bar, ibd_progress * 100);
    result_string += strprintf("Difficulty: %s\n\n", result["difficulty"].getValStr());

    result_string += strprintf(
        "%sNetwork: in %s, out %s, total %s%s\n",
        GREEN,
        result["connections"]["in"].getValStr(),
        result["connections"]["out"].getValStr(),
        result["connections"]["total"].getValStr(),
        RESET);
    result_string += strprintf("Version: %s\n", result["version"].getValStr());
    result_string += strprintf("Time offset (s): %s\n", result["timeoffset"].getValStr());

    // proxies
    std::map<std::string, std::vector<std::string>> proxy_networks;
    std::vector<std::string> ordered_proxies;

    for (const UniValue& network : result["networks"].getValues()) {
        const std::string proxy = network["proxy"].getValStr();
        if (proxy.empty()) continue;
        // Add proxy to ordered_proxy if has not been processed
        if (proxy_networks.find(proxy) == proxy_networks.end()) ordered_proxies.push_back(proxy);

        proxy_networks[proxy].push_back(network["name"].getValStr());
    }

    std::vector<std::string> formatted_proxies;
    formatted_proxies.reserve(ordered_proxies.size());
    for (const std::string& proxy : ordered_proxies) {
        formatted_proxies.emplace_back(strprintf("%s (%s)", proxy, Join(proxy_networks.find(proxy)->second, ", ")));
    }
    result_string += strprintf("Proxies: %s\n", formatted_proxies.empty() ? "n/a" : Join(formatted_proxies, ", "));

    result_string += strprintf("Min tx relay fee rate (%s/kvB): %s\n\n", CURRENCY_UNIT, result["relayfee"].getValStr());

    if (!result["has_wallet"].isNull()) {
        const std::string walletname = result["walletname"].getValStr();
        result_string += strprintf("%sWallet: %s%s\n", MAGENTA, walletname.empty() ? "\"\"" : walletname, RESET);

        result_string += strprintf("Keypool size: %s\n", result["keypoolsize"].getValStr());
        if (!result["unlocked_until"].isNull()) {
            result_string += strprintf("Unlocked until: %s\n", result["unlocked_until"].getValStr());
        }
        result_string += strprintf("Transaction fee rate (-paytxfee) (%s/kvB): %s\n\n", CURRENCY_UNIT, result["paytxfee"].getValStr());
    }
    if (!result["balance"].isNull()) {
        result_string += strprintf("%sBalance:%s %s\n\n", CYAN, RESET, result["balance"].getValStr());
    }

    if (!result["balances"].isNull()) {
        result_string += strprintf("%sBalances%s\n", CYAN, RESET);

        size_t max_balance_length{10};

        for (const std::string& wallet : result["balances"].getKeys()) {
            max_balance_length = std::max(result["balances"][wallet].getValStr().length(), max_balance_length);
        }

        for (const std::string& wallet : result["balances"].getKeys()) {
            result_string += strprintf("%*s %s\n",
                                       max_balance_length,
                                       result["balances"][wallet].getValStr(),
                                       wallet.empty() ? "\"\"" : wallet);
        }
        result_string += "\n";
    }

    const std::string warnings{result["warnings"].getValStr()};
    result_string += strprintf("%sWarnings:%s %s", YELLOW, RESET, warnings.empty() ? "(none)" : warnings);

    result.setStr(result_string);
}